

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O2

void duckdb::
     TemplatedWritePlain<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType,duckdb::ParquetUUIDOperator,false>
               (Vector *col,ColumnWriterStatistics *stats,idx_t chunk_start,idx_t chunk_end,
               ValidityMask *mask,WriteStream *ser)

{
  bool bVar1;
  long lVar2;
  int64_t extraout_RDX;
  uint64_t *puVar3;
  idx_t r;
  ParquetUUIDTargetType target_value_00;
  hugeint_t input;
  ParquetUUIDTargetType target_value;
  
  lVar2 = chunk_start * 0x10;
  puVar3 = (uint64_t *)(col->data + lVar2 + 8);
  for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&mask->super_TemplatedValidityMask<unsigned_long>,chunk_start);
    if (bVar1) {
      input.upper = extraout_RDX;
      input.lower = *puVar3;
      target_value = ParquetUUIDOperator::Operation<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                               ((ParquetUUIDOperator *)puVar3[-1],input);
      target_value_00.bytes._0_8_ = target_value.bytes._8_8_;
      target_value_00.bytes[8] = (char)lVar2;
      target_value_00.bytes[9] = (char)((ulong)lVar2 >> 8);
      target_value_00.bytes[10] = (char)((ulong)lVar2 >> 0x10);
      target_value_00.bytes[0xb] = (char)((ulong)lVar2 >> 0x18);
      target_value_00.bytes[0xc] = (char)((ulong)lVar2 >> 0x20);
      target_value_00.bytes[0xd] = (char)((ulong)lVar2 >> 0x28);
      target_value_00.bytes[0xe] = (char)((ulong)lVar2 >> 0x30);
      target_value_00.bytes[0xf] = (char)((ulong)lVar2 >> 0x38);
      ParquetUUIDOperator::HandleStats<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                ((ParquetUUIDOperator *)stats,target_value.bytes._0_8_,target_value_00);
      (**ser->_vptr_WriteStream)(ser,&target_value,0x10);
    }
    puVar3 = puVar3 + 2;
  }
  return;
}

Assistant:

static void TemplatedWritePlain(Vector &col, ColumnWriterStatistics *stats, const idx_t chunk_start,
                                const idx_t chunk_end, const ValidityMask &mask, WriteStream &ser) {
	static constexpr bool COPY_DIRECTLY_FROM_VECTOR =
	    ALL_VALID && std::is_same<SRC, TGT>::value && std::is_arithmetic<TGT>::value;

	const auto *const ptr = FlatVector::GetData<SRC>(col);

	TGT local_write[STANDARD_VECTOR_SIZE];
	idx_t local_write_count = 0;

	for (idx_t r = chunk_start; r < chunk_end; r++) {
		if (!ALL_VALID && !mask.RowIsValid(r)) {
			continue;
		}

		TGT target_value = OP::template Operation<SRC, TGT>(ptr[r]);
		OP::template HandleStats<SRC, TGT>(stats, target_value);

		if (COPY_DIRECTLY_FROM_VECTOR) {
			continue;
		}

		if (std::is_arithmetic<TGT>::value) {
			local_write[local_write_count++] = target_value;
			if (local_write_count == STANDARD_VECTOR_SIZE) {
				ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
				local_write_count = 0;
			}
		} else {
			OP::template WriteToStream<SRC, TGT>(target_value, ser);
		}
	}

	if (COPY_DIRECTLY_FROM_VECTOR) {
		ser.WriteData(const_data_ptr_cast(&ptr[chunk_start]), (chunk_end - chunk_start) * sizeof(TGT));
		return;
	}

	if (std::is_arithmetic<TGT>::value) {
		ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
	}
	// Else we already wrote to stream
}